

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_str_split(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  int local_50;
  int nMax;
  int nLen;
  int split_len;
  jx9_value *pValue;
  jx9_value *pArray;
  char *zEnd;
  char *zString;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  zString = (char *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if (nArg < 1) {
    jx9_result_bool(pCtx,0);
  }
  else {
    zEnd = jx9_value_to_string(*apArg,&local_50);
    if (local_50 < 1) {
      jx9_result_bool(pjStack_18,0);
    }
    else {
      nMax = 1;
      if (1 < apArg_local._4_4_) {
        nMax = jx9_value_to_int(*(jx9_value **)(zString + 8));
        if (nMax < 1) {
          jx9_result_bool(pjStack_18,0);
          return 0;
        }
        if (local_50 < nMax) {
          nMax = local_50;
        }
      }
      pValue = jx9_context_new_array(pjStack_18);
      _nLen = jx9_context_new_scalar(pjStack_18);
      if ((_nLen == (jx9_value *)0x0) || (pValue == (jx9_value *)0x0)) {
        jx9_result_bool(pjStack_18,0);
      }
      else {
        pArray = (jx9_value *)(zEnd + local_50);
        for (; zEnd < pArray; zEnd = zEnd + nMax) {
          iVar1 = (int)pArray - (int)zEnd;
          if (iVar1 < nMax) {
            nMax = iVar1;
          }
          jx9_value_string(_nLen,zEnd,nMax);
          jx9_array_add_elem(pValue,(jx9_value *)0x0,_nLen);
          jx9_value_reset_string_cursor(_nLen);
        }
        jx9_result_value(pjStack_18,pValue);
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_str_split(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString, *zEnd;
	jx9_value *pArray, *pValue;
	int split_len;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the target string */
	zString = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Nothing to process, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	split_len = (int)sizeof(char);
	if( nArg > 1 ){
		/* Split length */
		split_len = jx9_value_to_int(apArg[1]);
		if( split_len < 1 ){
			/* Invalid length, return FALSE */
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}
		if( split_len > nLen ){
			split_len = nLen;
		}
	}
	/* Create the array and the scalar value */
	pArray = jx9_context_new_array(pCtx);
	/*Chunk value */
	pValue = jx9_context_new_scalar(pCtx);
	if( pValue == 0 || pArray == 0 ){
		/* Return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the end of the string */
	zEnd = &zString[nLen];
	/* Perform the requested operation */
	for(;;){
		int nMax;
		if( zString >= zEnd ){
			/* No more input to process */
			break;
		}
		nMax = (int)(zEnd-zString);
		if( nMax < split_len ){
			split_len = nMax;
		}
		/* Copy the current chunk */
		jx9_value_string(pValue, zString, split_len);
		/* Insert it */
		jx9_array_add_elem(pArray, 0, pValue); /* Will make it's own copy */
		/* reset the string cursor */
		jx9_value_reset_string_cursor(pValue);
		/* Update position */
		zString += split_len;
	}
	/* 
	 * Return the array.
	 * Don't worry about freeing memory, everything will be automatically released
	 * upon we return from this function.
	 */
	jx9_result_value(pCtx, pArray);
	return JX9_OK;
}